

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RotationY.cpp
# Opt level: O3

void __thiscall
qclab::qgates::RotationY<std::complex<double>_>::apply
          (RotationY<std::complex<double>_> *this,Op op,int nbQubits,
          vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *vector,int offset)

{
  double dVar1;
  int iVar2;
  double c;
  uint uVar3;
  uint uVar4;
  undefined4 uVar5;
  uint uVar6;
  anon_class_32_4_6094e784_conflict f;
  anon_class_32_4_6094e784_conflict local_48;
  
  iVar2 = (*(this->super_QRotationGate1<std::complex<double>_>).super_QGate1<std::complex<double>_>.
            super_QObject<std::complex<double>_>._vptr_QObject[3])();
  local_48.c = (this->super_QRotationGate1<std::complex<double>_>).rotation_.angle_.cos_;
  dVar1 = (this->super_QRotationGate1<std::complex<double>_>).rotation_.angle_.sin_;
  local_48.vector = *(complex<double> **)vector;
  uVar5 = SUB84(dVar1,0);
  uVar6 = (uint)((ulong)dVar1 >> 0x20);
  uVar3 = uVar6 ^ 0x80000000;
  uVar4 = uVar6;
  if (op != NoTrans) {
    uVar4 = uVar3;
    uVar3 = uVar6;
  }
  local_48.s1 = (double)CONCAT44(uVar3,uVar5);
  local_48.s2 = (double)CONCAT44(uVar4,uVar5);
  apply2<qclab::qgates::lambda_RotationY<std::complex<double>,double>(qclab::Op,double,double,std::complex<double>*)::_lambda(unsigned_long,unsigned_long)_1_>
            (nbQubits,iVar2 + offset,&local_48);
  return;
}

Assistant:

void RotationY< T >::apply( Op op , const int nbQubits ,
                              std::vector< T >& vector ,
                              const int offset ) const {
    const int qubit = this->qubit() + offset ;
    auto f = lambda_RotationY( op , this->cos() , this->sin() , vector.data() );
    apply2( nbQubits , qubit , f ) ;
  }